

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::for_statement::for_statement
          (for_statement *this,source_extend *extend,statement_ptr *init,expression_ptr *cond,
          expression_ptr *iter,statement_ptr *s)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  pointer psVar4;
  statement_ptr *s_local;
  expression_ptr *iter_local;
  expression_ptr *cond_local;
  statement_ptr *init_local;
  source_extend *extend_local;
  for_statement *this_local;
  
  statement::syntax_node(&this->super_statement,extend);
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__for_statement_002a16f8;
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::unique_ptr
            (&this->init_,init);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            (&this->cond_,cond);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            (&this->iter_,iter);
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::unique_ptr(&this->s_,s);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->init_);
  bVar2 = true;
  if (bVar1) {
    psVar4 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator->
                       (&this->init_);
    iVar3 = (*(psVar4->super_syntax_node)._vptr_syntax_node[3])();
    bVar2 = true;
    if (iVar3 != 4) {
      psVar4 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator->
                         (&this->init_);
      iVar3 = (*(psVar4->super_syntax_node)._vptr_syntax_node[3])();
      bVar2 = iVar3 == 1;
    }
  }
  if (bVar2) {
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->s_);
    if (bVar2) {
      return;
    }
    __assert_fail("s_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x2ab,
                  "mjs::for_statement::for_statement(const source_extend &, statement_ptr &&, expression_ptr &&, expression_ptr &&, statement_ptr &&)"
                 );
  }
  __assert_fail("!init_ || init_->type() == statement_type::expression || init_->type() == statement_type::variable"
                ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0x2aa,
                "mjs::for_statement::for_statement(const source_extend &, statement_ptr &&, expression_ptr &&, expression_ptr &&, statement_ptr &&)"
               );
}

Assistant:

explicit for_statement(const source_extend& extend, statement_ptr&& init, expression_ptr&& cond, expression_ptr&& iter, statement_ptr&& s) : statement(extend), init_(std::move(init)), cond_(std::move(cond)), iter_(std::move(iter)), s_(std::move(s)) {
        assert(!init_ || init_->type() == statement_type::expression || init_->type() == statement_type::variable);
        assert(s_);
    }